

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parse_node_double_tuple_section
                (VrplibParser *p,Instance *instance,char *valuename,double *outarray)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  ulong uVar5;
  char *lexeme;
  bool bVar6;
  bool bVar7;
  double value;
  double local_58;
  char *local_50;
  Instance *local_48;
  ulong local_40;
  double *local_38;
  
  uVar1 = 0;
  local_50 = valuename;
  local_48 = instance;
  local_38 = outarray;
  do {
    uVar5 = uVar1;
    local_40 = (ulong)(local_48->num_customers + 1);
    if (uVar5 == local_40) break;
    _Var4 = true;
    bVar6 = false;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      lexeme = get_token_lexeme(p);
      if (lexeme == (char *)0x0) {
        _Var4 = false;
      }
      else {
        if (bVar6) {
          local_58 = 0.0;
          _Var3 = str_to_double(lexeme,&local_58);
          if (_Var3) {
            local_38[uVar5] = local_58;
          }
          else {
            _Var4 = false;
            parse_error(p,"Expected valid double for %s",local_50);
          }
        }
        else {
          _Var4 = parse_node_id(p,lexeme,(int32_t)uVar5);
        }
        free(lexeme);
      }
      bVar6 = true;
      bVar2 = false;
    } while (bVar7);
    _Var3 = parser_match_newline(p);
    if (!_Var3) {
      parse_error(p,"Expected newline after parsing node id `%d`",uVar5 & 0xffffffff);
      break;
    }
    uVar1 = uVar5 + 1;
  } while (_Var4 != false);
  return uVar5 == local_40;
}

Assistant:

static bool parse_node_double_tuple_section(VrplibParser *p, Instance *instance,
                                            char *valuename, double *outarray) {
    bool result = true;

    for (int32_t node_id = 0;
         result && (node_id != (instance->num_customers + 1)); node_id++) {
        for (int32_t i = 0; i < 2; i++) {
            char *lexeme = get_token_lexeme(p);
            if (!lexeme) {
                result = false;
            } else {
                switch (i) {
                case 0:
                    result = parse_node_id(p, lexeme, node_id);
                    break;
                case 1: {
                    // Parse the value
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p, "Expected valid double for %s",
                                    valuename);
                        result = false;
                    } else {
                        outarray[node_id] = value;
                    }
                    break;
                }
                }
            }

            if (lexeme) {
                free(lexeme);
            }
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline after parsing node id `%d`",
                        node_id);
            result = false;
        }
    }

    return result;
}